

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helics-broker.cpp
# Opt level: O3

void terminalFunction(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  BrokerApp *this;
  App *pAVar4;
  App *this_00;
  App *this_01;
  Option *pOVar5;
  bool cmdcont;
  string target;
  string cmdin;
  string query;
  App *restart;
  anon_class_8_1_4ed96917 status;
  helicsCLI11App termProg;
  undefined1 local_931;
  BrokerApp *local_930;
  string local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  App *local_8c8;
  BrokerApp **local_8c0;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  _Any_data local_518;
  code *local_508;
  code *pcStack_500;
  _Any_data local_4f8;
  code *local_4e8;
  code *pcStack_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *pcStack_4c0;
  _Any_data local_4b0;
  code *local_4a0;
  code *local_498;
  _Any_data local_490;
  code *local_480;
  code *local_478;
  _Any_data local_470;
  code *local_460;
  code *local_458;
  _Any_data local_450;
  code *local_440;
  code *local_438;
  _Any_data local_430;
  code *local_420;
  code *local_418;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  _Any_data local_3f0;
  code *local_3e0;
  code *local_3d8;
  helicsCLI11App local_3d0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"starting broker\n",0x10)
  ;
  this = (BrokerApp *)operator_new(0x30);
  helics::BrokerApp::BrokerApp(this,args);
  local_8c0 = &local_930;
  local_931 = true;
  local_930 = this;
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_538,"helics broker command line terminal","");
  paVar1 = &local_928.field_2;
  local_928._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"");
  helics::helicsCLI11App::helicsCLI11App(&local_3d0,&local_538,&local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != paVar1) {
    operator_delete(local_928._M_dataplus._M_p,
                    CONCAT71(local_928.field_2._M_allocated_capacity._1_7_,
                             local_928.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  CLI::App::ignore_case(&local_3d0.super_App,true);
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_558,"-q{false},--quit{false},--exit{false}","");
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_578,"close the terminal and wait for the broker to exit","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&local_3d0.super_App,&local_558,(bool *)&local_931,&local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"quit","");
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"close the terminal and  wait for the broker to exit","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_598,&local_5b8);
  local_3f0._8_8_ = 0;
  local_3d8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:236:20)>
              ::_M_invoke;
  local_3e0 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:236:20)>
              ::_M_manager;
  local_3f0._M_unused._M_object = &local_931;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_3f0);
  if (local_3e0 != (code *)0x0) {
    (*local_3e0)(&local_3f0,&local_3f0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"terminate","");
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"terminate the broker","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_5d8,&local_5f8);
  local_410._8_8_ = 0;
  local_410._M_unused._M_object = &local_930;
  local_3f8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:172:24)>
              ::_M_invoke;
  local_400 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:172:24)>
              ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_410);
  if (local_400 != (code *)0x0) {
    (*local_400)(&local_410,&local_410,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"terminate!","");
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_638,"forcibly terminate the broker and exit","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_618,&local_638);
  local_430._M_unused._M_object = &local_930;
  local_418 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:240:20)>
              ::_M_invoke;
  local_420 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:240:20)>
              ::_M_manager;
  local_430._8_8_ = &local_931;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_430);
  if (local_420 != (code *)0x0) {
    (*local_420)(&local_430,&local_430,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"restart","");
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_678,"restart the broker if it is not currently executing","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_658,&local_678);
  pAVar4->allow_extras_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_unused._M_object = (void *)0x0;
  local_4d8._8_8_ = 0;
  local_4c8 = (code *)0x0;
  pcStack_4c0 = (code *)0x0;
  local_8c8 = pAVar4;
  local_4d8._M_unused._M_object = operator_new(0x18);
  *(BrokerApp ***)local_4d8._M_unused._0_8_ = &local_930;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)local_4d8._M_unused._0_8_ + 8) = args;
  *(App ***)((long)local_4d8._M_unused._0_8_ + 0x10) = &local_8c8;
  pcStack_4c0 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:248:23)>
                ::_M_invoke;
  local_4c8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:248:23)>
              ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_4d8);
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
  }
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"restart!","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,"forcibly terminate the broker and restart it","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_698,&local_6b8);
  pAVar4->allow_extras_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  local_4e8 = (code *)0x0;
  pcStack_4e0 = (code *)0x0;
  local_4f8._M_unused._M_object = (void *)0x0;
  local_4f8._8_8_ = 0;
  local_4f8._M_unused._M_object = operator_new(0x18);
  *(BrokerApp ***)local_4f8._M_unused._0_8_ = &local_930;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)local_4f8._M_unused._0_8_ + 8) = args;
  *(App ***)((long)local_4f8._M_unused._0_8_ + 0x10) = &local_8c8;
  pcStack_4e0 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:256:9)>
                ::_M_invoke;
  local_4e8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:256:9)>
              ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_4f8);
  if (local_4e8 != (code *)0x0) {
    (*local_4e8)(&local_4f8,&local_4f8,__destroy_functor);
  }
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"status","");
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,"generate the current status of the broker","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_6d8,&local_6f8);
  local_450._8_8_ = 0;
  local_438 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:259:20)>
              ::_M_invoke;
  local_440 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:259:20)>
              ::_M_manager;
  local_450._M_unused._M_object = &local_8c0;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_450);
  if (local_440 != (code *)0x0) {
    (*local_440)(&local_450,&local_450,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"info","");
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_738,"get the current broker status and connection info","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_718,&local_738);
  local_470._8_8_ = 0;
  local_458 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:261:20)>
              ::_M_invoke;
  local_460 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:261:20)>
              ::_M_manager;
  local_470._M_unused._M_object = &local_8c0;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_470);
  if (local_460 != (code *)0x0) {
    (*local_460)(&local_470,&local_470,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"help","");
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"display the help","");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_758,&local_778);
  local_490._8_8_ = 0;
  local_478 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:262:67)>
              ::_M_invoke;
  local_480 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:262:67)>
              ::_M_manager;
  local_490._M_unused._0_8_ = (undefined8)&local_3d0;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_490);
  if (local_480 != (code *)0x0) {
    (*local_480)(&local_490,&local_490,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  local_928._M_string_length = 0;
  local_928.field_2._M_local_buf[0] = '\0';
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  local_8e8._M_string_length = 0;
  local_8e8.field_2._M_local_buf[0] = '\0';
  local_928._M_dataplus._M_p = (pointer)paVar1;
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"query","");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,
             "make a query of some target >>query <target> <query> or query <query> to query the broker"
             ,"");
  pAVar4 = CLI::App::add_subcommand(&local_3d0.super_App,&local_798,&local_7b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"targetGroup","");
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"");
  this_00 = &CLI::App::add_option_group<CLI::Option_group>(pAVar4,&local_7d8,&local_7f8)->super_App;
  this_00->default_startup = enabled;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"target","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"the name of object to target","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_00,&local_818,&local_928,&local_838);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"queryGroup","");
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"");
  this_01 = &CLI::App::add_option_group<CLI::Option_group>(pAVar4,&local_858,&local_878)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
  }
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"query","");
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"the query to make","");
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_01,&local_898,&local_8e8,&local_8b8);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  local_498 = CLI::std::
              _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:292:33)>
              ::_M_invoke;
  local_4a0 = CLI::std::
              _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:292:33)>
              ::_M_manager;
  local_4b0._M_unused._0_8_ = (undefined8)this_00;
  local_4b0._8_8_ = &local_928;
  CLI::std::function<void_(unsigned_long)>::operator=
            (&pAVar4->pre_parse_callback_,(function<void_(unsigned_long)> *)&local_4b0);
  if (local_4a0 != (code *)0x0) {
    (*local_4a0)(&local_4b0,&local_4b0,__destroy_functor);
  }
  local_508 = (code *)0x0;
  pcStack_500 = (code *)0x0;
  local_518._M_unused._M_object = (void *)0x0;
  local_518._8_8_ = 0;
  local_518._M_unused._M_object = operator_new(0x18);
  *(BrokerApp ***)local_518._M_unused._0_8_ = &local_930;
  *(string **)((long)local_518._M_unused._0_8_ + 8) = &local_928;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   ((long)local_518._M_unused._0_8_ + 0x10) = &local_8e8;
  pcStack_500 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:268:22)>
                ::_M_invoke;
  local_508 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:268:22)>
              ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar4->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar4->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_518);
  if (local_508 != (code *)0x0) {
    (*local_508)(&local_518,&local_518,__destroy_functor);
  }
  if (local_931 == true) {
    do {
      local_908._M_string_length = 0;
      local_908.field_2._M_local_buf[0] = '\0';
      local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nhelics_broker>>",0x10);
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\x10');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_908,cVar2);
      iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_908,"exit");
      if (iVar3 == 0) {
LAB_0018d761:
        local_931 = false;
      }
      else {
        iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(&local_908,"q");
        if (iVar3 == 0) goto LAB_0018d761;
        helics::helicsCLI11App::helics_parse<std::__cxx11::string&>(&local_3d0,&local_908);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_908._M_dataplus._M_p != &local_908.field_2) {
        operator_delete(local_908._M_dataplus._M_p,
                        CONCAT71(local_908.field_2._M_allocated_capacity._1_7_,
                                 local_908.field_2._M_local_buf[0]) + 1);
      }
    } while (local_931 != false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,
                    CONCAT71(local_8e8.field_2._M_allocated_capacity._1_7_,
                             local_8e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,
                    CONCAT71(local_928.field_2._M_allocated_capacity._1_7_,
                             local_928.field_2._M_local_buf[0]) + 1);
  }
  local_3d0.super_App._vptr_App = (_func_int **)&PTR__helicsCLI11App_00542d10;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d0.remArgs);
  CLI::std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&local_3d0.cbacks);
  CLI::App::~App(&local_3d0.super_App);
  if (local_930 != (BrokerApp *)0x0) {
    CLI::std::default_delete<helics::BrokerApp>::operator()
              ((default_delete<helics::BrokerApp> *)&local_930,local_930);
  }
  return;
}

Assistant:

void terminalFunction(std::vector<std::string> args)
{
    std::cout << "starting broker\n";
    auto broker = std::make_unique<helics::BrokerApp>(args);
    auto closeBroker = [&broker]() {
        if (!broker) {
            std::cout << "Broker has terminated\n";
            return;
        }
        broker->forceTerminate();
        while (broker->isConnected()) {
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
        }
        std::cout << "Broker has terminated\n";
    };

    auto restartBroker = [&broker, &args](const std::vector<std::string>& broker_args, bool force) {
        if (!broker_args.empty()) {
            args = broker_args;
        }
        if (!broker) {
            broker = std::make_unique<helics::BrokerApp>(args);
            std::cout << "broker has started\n";
        } else if (broker->isConnected()) {
            if (force) {
                broker->forceTerminate();
                broker = nullptr;
                broker = std::make_unique<helics::BrokerApp>(args);
                std::cout << "broker was forcibly terminated and restarted\n";
            } else {
                std::cout << "broker is currently running unable to restart\n";
            }
        } else {
            broker = nullptr;
            broker = std::make_unique<helics::BrokerApp>(args);
            std::cout << "broker has restarted\n";
        }
    };

    auto status = [&broker](bool addAddress) {
        if (!broker) {
            std::cout << "Broker is not available\n";
            return;
        }
        auto accepting = (*broker)->isOpenToNewFederates();
        auto connected = (*broker)->isConnected();
        auto id = (*broker)->getIdentifier();
        if (connected) {
            std::cout << "Broker (" << id << ") is connected and "
                      << ((accepting) ? "is" : "is not") << "accepting new federates\n";
            if (addAddress) {
                auto address = (*broker)->getAddress();
                std::cout << address << '\n';
            } else {
                auto cts = (*broker)->query("broker", "counts");
                std::cout << cts << '\n';
            }
        } else {
            std::cout << "Broker (" << id << ") is not connected \n";
        }
    };
    bool cmdcont = true;
    helics::helicsCLI11App termProg("helics broker command line terminal");
    termProg.ignore_case();
    termProg.add_flag("-q{false},--quit{false},--exit{false}",
                      cmdcont,
                      "close the terminal and wait for the broker to exit");
    termProg.add_subcommand("quit", "close the terminal and  wait for the broker to exit")
        ->callback([&cmdcont]() { cmdcont = false; });
    termProg.add_subcommand("terminate", "terminate the broker")->callback(closeBroker);

    termProg.add_subcommand("terminate!", "forcibly terminate the broker and exit")
        ->callback([closeBroker, &cmdcont]() {
            cmdcont = false;
            closeBroker();
        });

    auto* restart =
        termProg.add_subcommand("restart", "restart the broker if it is not currently executing")
            ->allow_extras();
    restart->callback([restartBroker, &restart]() {
        restartBroker(restart->remaining_for_passthrough(), false);
    });

    auto* frestart =
        termProg.add_subcommand("restart!", "forcibly terminate the broker and restart it")
            ->allow_extras();
    frestart->callback(
        [restartBroker, &restart]() { restartBroker(restart->remaining_for_passthrough(), true); });

    termProg.add_subcommand("status", "generate the current status of the broker")
        ->callback([&status]() { status(false); });
    termProg.add_subcommand("info", "get the current broker status and connection info")
        ->callback([&status]() { status(true); });
    termProg.add_subcommand("help", "display the help")->callback([&termProg]() {
        termProg.helics_parse("-?");
    });
    std::string target;
    std::string query;

    auto queryCall = [&broker, &target, &query]() {
        if (!broker) {
            std::cout << "Broker is not available\n";
            return;
        }
        std::string res;
        if (target.empty()) {
            res = (*broker)->query("broker", query);
        } else {
            res = (*broker)->query(target, query);
        }
        auto qvec = helics::vectorizeQueryResult(std::move(res));
        std::cout << "results: ";
        for (const auto& vres : qvec) {
            std::cout << vres << '\n';
        }
    };
    auto* querySub = termProg.add_subcommand(
        "query",
        "make a query of some target >>query <target> <query> or query <query> to query the broker");
    auto* qgroup1 = querySub->add_option_group("targetGroup")->enabled_by_default();
    qgroup1->add_option("target", target, "the name of object to target");
    auto* qgroup2 = querySub->add_option_group("queryGroup");
    qgroup2->add_option("query", query, "the query to make")->required();
    querySub->preparse_callback([qgroup1, &target](size_t argcount) {
        if (argcount < 2) {
            target.clear();
            qgroup1->disabled();
        }
    });
    querySub->callback(queryCall);
    while (cmdcont) {
        std::string cmdin;
        std::cout << "\nhelics_broker>>";
        std::getline(std::cin, cmdin);
        if (cmdin == "exit" || cmdin == "q") {  // provide a fast path to exit without going through
                                                // the terminal command line processor
            cmdcont = false;
            continue;
        }
        termProg.helics_parse(cmdin);
    }
}